

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any * __thiscall cs_impl::any::operator=(any *this,any *var)

{
  bool bVar1;
  proxy *ppVar2;
  any *in_RSI;
  any *in_RDI;
  
  bVar1 = is_same(in_RDI,in_RSI);
  if (!bVar1) {
    recycle(in_RSI);
    ppVar2 = duplicate(in_RSI);
    in_RDI->mDat = ppVar2;
  }
  return in_RDI;
}

Assistant:

any &operator=(const any &var)
		{
			if (!is_same(var)) {
				recycle();
				mDat = var.duplicate();
			}
			return *this;
		}